

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int zbuild_huffman(zhuffman *z,uint8 *sizelist,int num)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int sizes [17];
  int next_code [16];
  int aiStack_38 [2];
  
  sizes[0xc] = 0;
  sizes[0xd] = 0;
  sizes[0xe] = 0;
  sizes[0xf] = 0;
  sizes[8] = 0;
  sizes[9] = 0;
  sizes[10] = 0;
  sizes[0xb] = 0;
  sizes[4] = 0;
  sizes[5] = 0;
  sizes[6] = 0;
  sizes[7] = 0;
  sizes[0] = 0;
  sizes[1] = 0;
  sizes[2] = 0;
  sizes[3] = 0;
  sizes[0x10] = 0;
  memset(z,0xff,0x400);
  uVar3 = 0;
  uVar7 = (ulong)(uint)num;
  if (num < 1) {
    uVar7 = uVar3;
  }
  for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    sizes[sizelist[uVar3]] = sizes[sizelist[uVar3]] + 1;
  }
  lVar9 = 1;
  while (lVar9 != 0x10) {
    bVar4 = (byte)lVar9;
    piVar1 = sizes + lVar9;
    lVar9 = lVar9 + 1;
    if (1 << (bVar4 & 0x1f) < *piVar1) {
      __assert_fail("sizes[i] <= (1 << i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                    ,0x673,"int zbuild_huffman(zhuffman *, uint8 *, int)");
    }
  }
  iVar8 = 0;
  bVar4 = 0xf;
  lVar9 = -0xf;
  iVar10 = 0;
  while( true ) {
    if (lVar9 == 0) {
      z->maxcode[0x10] = 0x10000;
      for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
        bVar4 = sizelist[uVar3];
        if (bVar4 != 0) {
          iVar10 = next_code[bVar4];
          lVar9 = (ulong)z->firstsymbol[bVar4] + ((long)iVar10 - (ulong)z->firstcode[bVar4]);
          *(byte *)((long)z + lVar9 + 0x484) = bVar4;
          *(short *)((long)z + lVar9 * 2 + 0x5a4) = (short)uVar3;
          if (bVar4 < 10) {
            uVar5 = (ushort)iVar10 << 8 | (ushort)iVar10 >> 8;
            uVar6 = (uVar5 & 0xf0f) << 4 | (uVar5 & 0xf0f0) >> 4;
            uVar6 = (uVar6 >> 2 & 0x3333) + (uVar6 & 0x3333) * 4;
            for (uVar11 = (ulong)((uVar6 >> 1 & 0x5555) + (uVar6 & 0x5555) * 2 >>
                                 (0x10 - bVar4 & 0x1f)); uVar11 < 0x200;
                uVar11 = uVar11 + (1L << (bVar4 & 0x3f))) {
              z->fast[uVar11] = (uint16)lVar9;
            }
          }
          next_code[bVar4] = iVar10 + 1;
        }
      }
      return 1;
    }
    aiStack_38[lVar9] = iVar10;
    *(short *)((long)z->maxcode + lVar9 * 2) = (short)iVar10;
    *(short *)(z->size + lVar9 * 2) = (short)iVar8;
    iVar2 = sizes[lVar9 + 0x10];
    iVar10 = iVar10 + iVar2;
    if ((iVar2 != 0) && (1 << ((char)lVar9 + 0x10U & 0x1f) < iVar10)) break;
    z->maxcode[lVar9 + 0x10] = iVar10 << (bVar4 & 0x1f);
    iVar10 = iVar10 * 2;
    iVar8 = iVar8 + iVar2;
    bVar4 = bVar4 - 1;
    lVar9 = lVar9 + 1;
  }
  failure_reason = "Corrupt JPEG";
  return 0;
}

Assistant:

static int zbuild_huffman(zhuffman *z, uint8 *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 255, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      assert(sizes[i] <= (1 << i));
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (uint16) code;
      z->firstsymbol[i] = (uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return e("bad codelengths","Corrupt JPEG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         z->size[c] = (uint8)s;
         z->value[c] = (uint16)i;
         if (s <= ZFAST_BITS) {
            int k = bit_reverse(next_code[s],s);
            while (k < (1 << ZFAST_BITS)) {
               z->fast[k] = (uint16) c;
               k += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}